

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp
          (FoldSpecConstantOpAndCompositePass *this,inst_iterator *pos)

{
  Instruction *this_00;
  uint32_t after;
  uint32_t before;
  Operand *pOVar1;
  Instruction *this_01;
  
  this_00 = (pos->super_iterator).node_;
  pOVar1 = Instruction::GetInOperand(this_00,0);
  if (pOVar1->type == SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER) {
    this_01 = FoldWithInstructionFolder(this,pos);
    if (this_01 == (Instruction *)0x0) {
      this_01 = DoComponentWiseOperation(this,pos);
    }
    if (this_01 != (Instruction *)0x0) {
      before = 0;
      after = 0;
      if (this_01->has_result_id_ == true) {
        after = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      if (this_00->has_result_id_ == true) {
        before = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith((this->super_Pass).context_,before,after);
      IRContext::KillDef((this->super_Pass).context_,before);
    }
    return this_01 != (Instruction *)0x0;
  }
  __assert_fail("inst->GetInOperand(0).type == SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER && \"The first in-operand of OpSpecConstantOp instruction must be of \" \"SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER type\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                ,0x74,
                "bool spvtools::opt::FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp(Module::inst_iterator *)"
               );
}

Assistant:

bool FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp(
    Module::inst_iterator* pos) {
  Instruction* inst = &**pos;
  Instruction* folded_inst = nullptr;
  assert(inst->GetInOperand(0).type ==
             SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER &&
         "The first in-operand of OpSpecConstantOp instruction must be of "
         "SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER type");

  folded_inst = FoldWithInstructionFolder(pos);
  if (!folded_inst) {
    folded_inst = DoComponentWiseOperation(pos);
  }
  if (!folded_inst) return false;

  // Replace the original constant with the new folded constant, kill the
  // original constant.
  uint32_t new_id = folded_inst->result_id();
  uint32_t old_id = inst->result_id();
  context()->ReplaceAllUsesWith(old_id, new_id);
  context()->KillDef(old_id);
  return true;
}